

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

boolean clear_stale_map(char oclass,uint material)

{
  monst *pmVar1;
  level *plVar2;
  boolean bVar3;
  uint uVar4;
  obj *poVar5;
  long lVar6;
  ulong uVar7;
  vptrs *pvVar8;
  obj *poVar9;
  ulong uVar10;
  
  uVar7 = (ulong)material;
  lVar6 = 1;
  bVar3 = '\0';
  do {
    if (lVar6 == 0x50) {
      return bVar3;
    }
    uVar10 = 0;
LAB_0015e62d:
    plVar2 = level;
    if (uVar10 != 0x15) {
      uVar4 = *(uint *)(level->locations[lVar6] + uVar10) >> 0xb & 0x3ff;
      if (uVar4 != 0) {
        if (oclass == '\x14') {
          if ((level->objects[lVar6][uVar10] == (obj *)0x0) &&
             (((pmVar1 = level->monsters[lVar6][uVar10], pmVar1 == (monst *)0x0 ||
               ((pmVar1->field_0x61 & 2) != 0)) || (pmVar1->minvent == (obj *)0x0)))) {
LAB_0015e7ad:
            uVar7 = uVar10 & 0xffffffff;
            unmap_object((int)lVar6,(int)uVar10);
            bVar3 = '\x01';
          }
        }
        else if ((material == 0) ||
                ((*(ushort *)&objects[(ulong)uVar4 - 1].field_0x11 >> 4 & 0x1f) != material)) {
          if ((oclass != '\0') && (objects[(ulong)uVar4 - 1].oc_class == oclass)) {
            pvVar8 = (vptrs *)(level->objects[lVar6] + uVar10);
            do {
              poVar9 = pvVar8->v_nexthere;
              if (poVar9 == (obj *)0x0) {
                pmVar1 = plVar2->monsters[lVar6][uVar10];
                if ((pmVar1 == (monst *)0x0) || ((pmVar1->field_0x61 & 2) != 0)) goto LAB_0015e7ad;
                poVar9 = (obj *)&pmVar1->minvent;
                goto LAB_0015e792;
              }
              uVar7 = (ulong)(uint)(int)oclass;
              poVar5 = o_in(poVar9,oclass);
              pvVar8 = &poVar9->v;
            } while (poVar5 == (obj *)0x0);
          }
        }
        else {
          pvVar8 = (vptrs *)(level->objects[lVar6] + uVar10);
          do {
            poVar9 = pvVar8->v_nexthere;
            if (poVar9 == (obj *)0x0) {
              pmVar1 = plVar2->monsters[lVar6][uVar10];
              if ((pmVar1 == (monst *)0x0) || ((pmVar1->field_0x61 & 2) != 0)) goto LAB_0015e7ad;
              poVar9 = (obj *)&pmVar1->minvent;
              goto LAB_0015e761;
            }
            poVar5 = o_material(poVar9,(uint)uVar7);
            pvVar8 = &poVar9->v;
          } while (poVar5 == (obj *)0x0);
        }
      }
      goto LAB_0015e7c1;
    }
    lVar6 = lVar6 + 1;
  } while( true );
  while( true ) {
    uVar7 = (ulong)(uint)(int)oclass;
    poVar5 = o_in(poVar9,oclass);
    if (poVar5 != (obj *)0x0) break;
LAB_0015e792:
    poVar9 = poVar9->nobj;
    if (poVar9 == (obj *)0x0) goto LAB_0015e7ad;
  }
  goto LAB_0015e7c1;
  while (poVar5 = o_material(poVar9,(uint)uVar7), poVar5 == (obj *)0x0) {
LAB_0015e761:
    poVar9 = poVar9->nobj;
    if (poVar9 == (obj *)0x0) goto LAB_0015e7ad;
  }
LAB_0015e7c1:
  uVar10 = uVar10 + 1;
  goto LAB_0015e62d;
}

Assistant:

static boolean clear_stale_map(char oclass, unsigned material)
{
	int zx, zy;
	boolean change_made = FALSE;

	for (zx = 1; zx < COLNO; zx++)
	    for (zy = 0; zy < ROWNO; zy++)
		if (check_map_spot(zx, zy, oclass,material)) {
		    unmap_object(zx, zy);
		    change_made = TRUE;
		}

	return change_made;
}